

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O3

TupleDataChunk * __thiscall
duckdb::TupleDataChunk::operator=(TupleDataChunk *this,TupleDataChunk *other)

{
  ContinuousIdSet CVar1;
  idx_t iVar2;
  _Head_base<0UL,_std::mutex_*,_false> _Var3;
  _Head_base<0UL,_std::mutex_*,_false> _Var4;
  _Head_base<0UL,_std::mutex_*,_false> _Var5;
  
  CVar1 = this->part_ids;
  this->part_ids = other->part_ids;
  other->part_ids = CVar1;
  CVar1 = this->row_block_ids;
  this->row_block_ids = other->row_block_ids;
  other->row_block_ids = CVar1;
  CVar1 = this->heap_block_ids;
  this->heap_block_ids = other->heap_block_ids;
  other->heap_block_ids = CVar1;
  iVar2 = this->count;
  this->count = other->count;
  other->count = iVar2;
  _Var3._M_head_impl =
       (this->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
       super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl;
  (this->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
  super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = (mutex *)0x0;
  _Var4._M_head_impl =
       (other->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
       super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl;
  (other->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
  super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = (mutex *)0x0;
  _Var5._M_head_impl =
       (this->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
       super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl;
  (this->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
  super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var5._M_head_impl != (mutex *)0x0) {
    operator_delete(_Var5._M_head_impl);
  }
  _Var4._M_head_impl =
       (other->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
       super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
       super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl;
  (other->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
  super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var4._M_head_impl != (mutex *)0x0) {
    operator_delete(_Var4._M_head_impl);
  }
  return this;
}

Assistant:

TupleDataChunk &TupleDataChunk::operator=(TupleDataChunk &&other) noexcept {
	SwapTupleDataChunk(*this, other);
	return *this;
}